

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O1

int asio_service_test::auto_forwarding_test(bool async)

{
  undefined8 *puVar1;
  char cVar2;
  ostream oVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  ThreadArgs *u_args;
  long *plVar7;
  ulong uVar8;
  shared_ptr<nuraft::buffer> *psVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  RaftAsioPkg *pRVar13;
  int __how;
  int __how_00;
  int __how_01;
  _List_node_base *p_Var14;
  char cVar15;
  int __how_02;
  undefined1 auVar16 [8];
  ulong __val;
  RaftAsioPkg **entry;
  ostream *poVar17;
  undefined8 uVar18;
  long lVar19;
  initializer_list<RaftAsioPkg_*> __l;
  string __str;
  raft_params param;
  ptr<buffer> h_result;
  uint64_t val;
  vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> th;
  mutex handlers_lock;
  list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
  handlers;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  RaftAsioPkg s1;
  RaftAsioPkg s2;
  RaftAsioPkg s3;
  buffer_serializer local_558;
  undefined1 local_538 [8];
  undefined1 local_530 [8];
  undefined1 auStack_528 [60];
  int32 local_4ec;
  return_method_type local_4e0;
  ptr<buffer> local_4d0;
  element_type *local_4c0;
  undefined1 local_4b8 [24];
  ThreadArgs *local_4a0;
  undefined1 local_498 [48];
  _List_base<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
  local_468;
  _Any_data local_450;
  _Any_data local_438;
  element_type *local_428;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_420;
  element_type *local_418;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  element_type local_408 [2];
  undefined1 *local_3f8;
  long local_3f0;
  undefined1 local_3e8 [16];
  undefined1 *local_3d8;
  long local_3d0;
  undefined1 local_3c8 [16];
  _Any_data local_3b8;
  code *local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_390 [8];
  _Alloc_hider local_388;
  char local_378 [16];
  undefined1 local_368 [16];
  TestSm *local_358;
  raft_server *local_328;
  undefined2 local_298;
  bool local_296;
  element_type *local_290;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_288;
  element_type *local_280;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_278;
  undefined1 local_270 [8];
  _Alloc_hider local_268;
  char local_258 [16];
  undefined1 local_248 [16];
  TestSm *local_238;
  raft_server *local_208;
  undefined2 local_178;
  bool local_176;
  element_type *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_168;
  element_type *local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_158;
  undefined1 local_150 [8];
  _Alloc_hider local_148;
  char local_138 [16];
  undefined1 local_128 [16];
  TestSm *local_118;
  raft_server *local_e8;
  undefined2 local_58;
  bool local_56;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  string *msg;
  
  raft_functional_common::reset_log_files();
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"tcp://127.0.0.1:20010","");
  local_3f8 = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"tcp://127.0.0.1:20020","");
  local_418 = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"tcp://127.0.0.1:20030","");
  local_390._0_4_ = 1;
  local_388._M_p = local_378;
  std::__cxx11::string::_M_construct<char*>((string *)&local_388,local_3d8,local_3d8 + local_3d0);
  memset(local_368,0,0xd0);
  local_298._0_1_ = true;
  local_298._1_1_ = false;
  local_296 = false;
  local_290 = (element_type *)0x0;
  _Stack_288._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_280 = (element_type *)0x0;
  _Stack_278._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_270._0_4_ = 2;
  local_268._M_p = local_258;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_3f8,local_3f8 + local_3f0);
  memset(local_248,0,0xd0);
  local_178._0_1_ = true;
  local_178._1_1_ = false;
  local_176 = false;
  local_170 = (element_type *)0x0;
  _Stack_168._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_160 = (element_type *)0x0;
  _Stack_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_150._0_4_ = 3;
  local_148._M_p = local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_418,
             (long)&local_418->_vptr_logger + (long)&(local_410._M_pi)->_vptr__Sp_counted_base);
  memset(local_128,0,0xd0);
  local_58._0_1_ = true;
  local_58._1_1_ = false;
  local_56 = false;
  local_50 = (element_type *)0x0;
  _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40 = (element_type *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_538 = (undefined1  [8])local_390;
  local_530 = (undefined1  [8])local_270;
  auStack_528._0_8_ = local_150;
  __l._M_len = 3;
  __l._M_array = (iterator)local_538;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)&local_450,__l,
             (allocator_type *)local_498);
  TestSuite::_msg("launching asio-raft servers\n");
  local_538 = (undefined1  [8])((ulong)local_538 & 0xffffffffffffff00);
  local_530 = (undefined1  [8])0x0;
  auStack_528._0_8_ = 0;
  auStack_528._8_8_ = (_Manager_type)0x0;
  auStack_528._16_8_ = (_Base_ptr)0x0;
  auStack_528._24_2_ = 1;
  iVar5 = launch_servers((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)&local_450,false,
                         false,true,(init_options *)local_538);
  if ((_Manager_type)auStack_528._8_8_ != (_Manager_type)0x0) {
    (*(code *)auStack_528._8_8_)(local_530,local_530,3);
  }
  if (iVar5 != 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_538,(long)local_530);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
    lVar11 = *(long *)poVar6;
    *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x10) = 4;
    poVar17 = poVar6 + *(long *)(lVar11 + -0x18);
    if (poVar6[*(long *)(lVar11 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar3 = (ostream)std::ios::widen((char)poVar17);
      poVar17[0xe0] = oVar3;
      poVar17[0xe1] = (ostream)0x1;
    }
    poVar17[0xe0] = (ostream)0x30;
    local_498._0_8_ = pthread_self();
    std::_Hash_bytes(local_498,8,0xc70f6907);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auto_forwarding_test",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x588);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,-1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    if (local_538 != (undefined1  [8])auStack_528) {
      operator_delete((void *)local_538);
    }
    iVar5 = -1;
    TestSuite::failHandler();
    goto LAB_001a9c05;
  }
  TestSuite::_msg("organizing raft group\n");
  iVar5 = make_group((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)&local_450);
  if (iVar5 != 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_538,(long)local_530);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
    lVar11 = *(long *)poVar6;
    *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x10) = 4;
    poVar17 = poVar6 + *(long *)(lVar11 + -0x18);
    if (poVar6[*(long *)(lVar11 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar3 = (ostream)std::ios::widen((char)poVar17);
      poVar17[0xe0] = oVar3;
      poVar17[0xe1] = (ostream)0x1;
    }
    poVar17[0xe0] = (ostream)0x30;
    local_498._0_8_ = pthread_self();
    std::_Hash_bytes(local_498,8,0xc70f6907);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auto_forwarding_test",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x58b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,-1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    if (local_538 != (undefined1  [8])auStack_528) {
      operator_delete((void *)local_538);
    }
    iVar5 = -1;
    TestSuite::failHandler();
    goto LAB_001a9c05;
  }
  if (local_450._M_unused._M_object != (void *)local_450._8_8_) {
    uVar18 = local_450._M_unused._0_8_;
    do {
      lVar11 = *(long *)uVar18;
      nuraft::raft_server::get_current_params
                ((raft_params *)local_538,*(raft_server **)(lVar11 + 0x68));
      auStack_528[0x39] = true;
      local_4ec = 2;
      if (async) {
        local_4e0 = async_handler;
      }
      nuraft::raft_server::update_params(*(raft_server **)(lVar11 + 0x68),(raft_params *)local_538);
      uVar18 = uVar18 + 8;
    } while (uVar18 != local_450._8_8_);
  }
  local_498._16_8_ = 0;
  local_498._24_8_ = (__pthread_internal_list *)0x0;
  local_498._0_8_ = (_Invoker_type)0x0;
  local_498._8_8_ = (void *)0x0;
  local_498._32_8_ = (__pthread_internal_list *)0x0;
  local_468._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_468;
  local_468._M_impl._M_node._M_size = 0;
  local_4b8._16_8_ = 0;
  local_4b8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4b8._8_8_ = (void *)0x0;
  local_468._M_impl._M_node.super__List_node_base._M_prev =
       local_468._M_impl._M_node.super__List_node_base._M_next;
  local_4b8._0_8_ = operator_new(0x6e0);
  local_4b8._16_8_ = local_4b8._0_8_ + 0x6e0;
  lVar11 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_4b8._0_8_ + 0x40))->
                     _vptr__Sp_counted_base + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_4b8._0_8_ + 0x30))->
                     _vptr__Sp_counted_base + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_4b8._0_8_ + 0x20))->
                     _vptr__Sp_counted_base + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_4b8._0_8_ + 0x10))->
                     _vptr__Sp_counted_base + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b8._0_8_)->
                     _vptr__Sp_counted_base + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)
     ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_4b8._0_8_ + 0x50))->
             _vptr__Sp_counted_base + lVar11) = 0;
    lVar11 = lVar11 + 0x58;
  } while (lVar11 != 0x6e0);
  local_4b8._8_8_ = local_4b8._0_8_ + 0x6e0;
  u_args = (ThreadArgs *)operator_new(0xa0);
  lVar19 = 0;
  memset(u_args,0,0xa0);
  lVar11 = 0;
  local_4a0 = u_args;
  do {
    uVar18 = local_4b8._0_8_;
    *(long *)u_args = lVar11;
    local_438._M_unused._M_object = (_Invoker_type)0x0;
    local_438._M_pod_data[8] = false;
    local_438._M_pod_data[9] = false;
    local_438._M_pod_data[10] = false;
    local_438._11_5_ = 0;
    local_428 = (element_type *)0x0;
    _Stack_420._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_438._M_unused._M_object = operator_new(0x18);
    *(undefined1 **)local_438._M_unused._0_8_ = local_270;
    *(undefined1 **)((long)local_438._M_unused._0_8_ + 8) = local_498;
    *(_List_base<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
      **)((long)local_438._M_unused._0_8_ + 0x10) = &local_468;
    _Stack_420._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         _Function_handler<int_(TestSuite::ThreadArgs_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1440:21)>
         ::_M_invoke;
    local_428 = (element_type *)
                std::
                _Function_handler<int_(TestSuite::ThreadArgs_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1440:21)>
                ::_M_manager;
    local_3b8._M_unused._M_object = (void *)0x0;
    local_3b8._8_8_ = 0;
    local_3a8 = (code *)0x0;
    uStack_3a0 = 0;
    TestSuite::ThreadHolder::spawn
              ((ThreadHolder *)((long)(_func_int ***)uVar18 + lVar19),u_args,
               (ThreadFunc *)&local_438,(ThreadExitHandler *)&local_3b8);
    if (local_3a8 != (code *)0x0) {
      (*local_3a8)(&local_3b8,&local_3b8,__destroy_functor);
    }
    if (local_428 != (element_type *)0x0) {
      (*(code *)local_428)(&local_438,&local_438,3);
    }
    lVar11 = lVar11 + 1;
    u_args = u_args + 8;
    lVar19 = lVar19 + 0x58;
  } while (lVar11 != 0x14);
  local_538 = (undefined1  [8])auStack_528;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"replication","");
  TestSuite::sleep_sec(1,(string *)local_538);
  if (local_538 != (undefined1  [8])auStack_528) {
    operator_delete((void *)local_538);
  }
  lVar11 = 0;
  do {
    TestSuite::ThreadHolder::join
              ((ThreadHolder *)((long)(_func_int ***)local_4b8._0_8_ + lVar11),false);
    iVar5 = *(int *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_4b8._0_8_ + 0x50))->_vptr__Sp_counted_base + lVar11);
    if (iVar5 != 0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_538,(long)local_530);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
      lVar11 = *(long *)poVar6;
      *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x10) = 4;
      poVar17 = poVar6 + *(long *)(lVar11 + -0x18);
      if (poVar6[*(long *)(lVar11 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar17);
        poVar17[0xe0] = oVar3;
        poVar17[0xe1] = (ostream)0x1;
      }
      poVar17[0xe0] = (ostream)0x30;
      local_558._0_8_ = pthread_self();
      std::_Hash_bytes(&local_558,8,0xc70f6907);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auto_forwarding_test",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5b7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"    value of: \x1b[1;34mth[ii].getResult()\x1b[0m\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"0",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
      if (local_538 != (undefined1  [8])auStack_528) {
        operator_delete((void *)local_538);
      }
      iVar5 = -1;
      TestSuite::failHandler();
      goto LAB_001a9bde;
    }
    lVar11 = lVar11 + 0x58;
  } while (lVar11 != 0x6e0);
  __val = 0;
  do {
    cVar15 = '\x01';
    if (9 < __val) {
      uVar12 = __val;
      cVar2 = '\x04';
      do {
        cVar15 = cVar2;
        if (uVar12 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_001a88a1;
        }
        if (uVar12 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_001a88a1;
        }
        if (uVar12 < 10000) goto LAB_001a88a1;
        bVar4 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar2 = cVar15 + '\x04';
      } while (bVar4);
      cVar15 = cVar15 + '\x01';
    }
LAB_001a88a1:
    local_558._0_8_ = &local_558.pos_;
    std::__cxx11::string::_M_construct((ulong)&local_558,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_558._0_8_,(uint)local_558.buf_,__val);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,0x4bef66);
    local_538 = (undefined1  [8])auStack_528;
    pRVar13 = (RaftAsioPkg *)(plVar7 + 2);
    if ((RaftAsioPkg *)*plVar7 == pRVar13) {
      auStack_528._0_8_ = *(undefined8 *)pRVar13;
      auStack_528._8_8_ = plVar7[3];
    }
    else {
      auStack_528._0_8_ = *(undefined8 *)pRVar13;
      local_538 = (undefined1  [8])*plVar7;
    }
    local_530 = (undefined1  [8])plVar7[1];
    *plVar7 = (long)pRVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((size_t *)local_558._0_8_ != &local_558.pos_) {
      operator_delete((void *)local_558._0_8_);
    }
    uVar8 = raft_functional_common::TestSm::isCommitted(local_358,(string *)local_538);
    if ((int)uVar8 < 1) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_558._0_8_,
                          CONCAT44(local_558.buf_._4_4_,(uint)local_558.buf_));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
      lVar11 = *(long *)poVar6;
      *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x10) = 4;
      poVar17 = poVar6 + *(long *)(lVar11 + -0x18);
      if (poVar6[*(long *)(lVar11 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar17);
        poVar17[0xe0] = oVar3;
        poVar17[0xe1] = (ostream)0x1;
      }
      poVar17[0xe0] = (ostream)0x30;
      local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pthread_self();
      std::_Hash_bytes(&local_4d0,8,0xc70f6907);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auto_forwarding_test",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5bd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\x1b[1;34ms1.getTestSm()->isCommitted(test_msg) > 0\x1b[0m\n",0x35);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    value of ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\x1b[1;32ms1.getTestSm()->isCommitted(test_msg)\x1b[0m: ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;31m",7);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    value of ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;32m0\x1b[0m: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;31m",7);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
      if ((size_t *)local_558._0_8_ != &local_558.pos_) {
        operator_delete((void *)local_558._0_8_);
      }
      TestSuite::failHandler();
      if (local_538 != (undefined1  [8])auStack_528) {
        operator_delete((void *)local_538);
      }
      goto LAB_001a9bd9;
    }
    if (local_538 != (undefined1  [8])auStack_528) {
      operator_delete((void *)local_538);
    }
    __val = __val + 1;
  } while (__val != 0x14);
  local_530 = (undefined1  [8])((ulong)local_530 & 0xffffffff00000000);
  auStack_528._0_8_ = 0;
  auStack_528._8_8_ = local_530;
  auStack_528._24_8_ = 0;
  auStack_528._16_8_ = auStack_528._8_8_;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)local_498);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  if (local_468._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_468) {
    p_Var14 = local_468._M_impl._M_node.super__List_node_base._M_next;
    do {
      psVar9 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
               ::get((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                      *)p_Var14[1]._M_next);
      local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar9->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (psVar9->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      if (local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (buffer *)0x0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        poVar6 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_558._0_8_,
                            CONCAT44(local_558.buf_._4_4_,(uint)local_558.buf_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
        lVar11 = *(long *)poVar6;
        *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x10) = 4;
        poVar17 = poVar6 + *(long *)(lVar11 + -0x18);
        if (poVar6[*(long *)(lVar11 + -0x18) + 0xe1] == (ostream)0x0) {
          oVar3 = (ostream)std::ios::widen((char)poVar17);
          poVar17[0xe0] = oVar3;
          poVar17[0xe1] = (ostream)0x1;
        }
        poVar17[0xe0] = (ostream)0x30;
        local_4c0 = (element_type *)pthread_self();
        std::_Hash_bytes(&local_4c0,8,0xc70f6907);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auto_forwarding_test",0x14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5c6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"    value of: \x1b[1;34mh_result\x1b[0m\n",0x22);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"non-NULL",8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"NULL",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
        if ((size_t *)local_558._0_8_ != &local_558.pos_) {
          operator_delete((void *)local_558._0_8_);
        }
        TestSuite::failHandler();
LAB_001a9bb0:
        if (local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        goto LAB_001a9bc2;
      }
      sVar10 = nuraft::buffer::size
                         (local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      if ((int)sVar10 != 8) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        poVar6 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_558._0_8_,
                            CONCAT44(local_558.buf_._4_4_,(uint)local_558.buf_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
        lVar11 = *(long *)poVar6;
        *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x10) = 4;
        poVar17 = poVar6 + *(long *)(lVar11 + -0x18);
        if (poVar6[*(long *)(lVar11 + -0x18) + 0xe1] == (ostream)0x0) {
          oVar3 = (ostream)std::ios::widen((char)poVar17);
          poVar17[0xe0] = oVar3;
          poVar17[0xe1] = (ostream)0x1;
        }
        poVar17[0xe0] = (ostream)0x30;
        local_4c0 = (element_type *)pthread_self();
        std::_Hash_bytes(&local_4c0,8,0xc70f6907);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auto_forwarding_test",0x14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5c7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"    value of: \x1b[1;34mh_result->size()\x1b[0m\n",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)sVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
        if ((size_t *)local_558._0_8_ != &local_558.pos_) {
          operator_delete((void *)local_558._0_8_);
        }
        TestSuite::failHandler();
        goto LAB_001a9bb0;
      }
      nuraft::buffer_serializer::buffer_serializer(&local_558,&local_4d0,LITTLE);
      local_4c0 = (element_type *)nuraft::buffer_serializer::get_u64(&local_558);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)local_538,(unsigned_long *)&local_4c0);
      if (local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      p_Var14 = (((_List_impl *)&p_Var14->_M_next)->_M_node).super__List_node_base._M_next;
    } while (p_Var14 != (_List_node_base *)&local_468);
  }
  if (auStack_528._24_8_ == 0x14) {
    pthread_mutex_unlock((pthread_mutex_t *)local_498);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)local_538);
    bVar4 = raft_functional_common::TestSm::isSame(local_238,local_358,false);
    if (bVar4) {
      bVar4 = raft_functional_common::TestSm::isSame(local_118,local_358,false);
      iVar5 = (int)local_358;
      if (bVar4) {
        nuraft::raft_server::shutdown(local_328,iVar5,__how);
        nuraft::raft_server::shutdown(local_208,iVar5,__how_00);
        nuraft::raft_server::shutdown(local_e8,iVar5,__how_01);
        local_538 = (undefined1  [8])auStack_528;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"shutting down","");
        msg = (string *)local_538;
        TestSuite::sleep_sec(1,msg);
        __how_02 = (int)msg;
        auVar16 = local_538;
        if (local_538 != (undefined1  [8])auStack_528) {
          operator_delete((void *)local_538);
        }
        iVar5 = 0;
        SimpleLogger::shutdown(SUB84(auVar16,0),__how_02);
        goto LAB_001a9bde;
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_538,(long)local_530);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
      lVar11 = *(long *)poVar6;
      *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x10) = 4;
      poVar17 = poVar6 + *(long *)(lVar11 + -0x18);
      if (poVar6[*(long *)(lVar11 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar17);
        poVar17[0xe0] = oVar3;
        poVar17[0xe1] = (ostream)0x1;
      }
      poVar17[0xe0] = (ostream)0x30;
      local_558._0_8_ = pthread_self();
      std::_Hash_bytes(&local_558,8,0xc70f6907);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auto_forwarding_test",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5d2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                 ,0x43);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"true",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"false",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    }
    else {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_538,(long)local_530);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
      lVar11 = *(long *)poVar6;
      *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x10) = 4;
      poVar17 = poVar6 + *(long *)(lVar11 + -0x18);
      if (poVar6[*(long *)(lVar11 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar17);
        poVar17[0xe0] = oVar3;
        poVar17[0xe1] = (ostream)0x1;
      }
      poVar17[0xe0] = (ostream)0x30;
      local_558._0_8_ = pthread_self();
      std::_Hash_bytes(&local_558,8,0xc70f6907);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auto_forwarding_test",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5d1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                 ,0x43);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"true",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"false",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    }
    if (local_538 != (undefined1  [8])auStack_528) {
      operator_delete((void *)local_538);
    }
    iVar5 = -1;
    TestSuite::failHandler();
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_558._0_8_,
                        CONCAT44(local_558.buf_._4_4_,(uint)local_558.buf_));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
    lVar11 = *(long *)poVar6;
    *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar6 + *(long *)(lVar11 + -0x18) + 0x10) = 4;
    poVar17 = poVar6 + *(long *)(lVar11 + -0x18);
    if (poVar6[*(long *)(lVar11 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar3 = (ostream)std::ios::widen((char)poVar17);
      poVar17[0xe0] = oVar3;
      poVar17[0xe1] = (ostream)0x1;
    }
    poVar17[0xe0] = (ostream)0x30;
    local_4d0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pthread_self();
    std::_Hash_bytes(&local_4d0,8,0xc70f6907);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"auto_forwarding_test",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5cd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    value of: \x1b[1;34mcommit_results.size()\x1b[0m\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    if ((size_t *)local_558._0_8_ != &local_558.pos_) {
      operator_delete((void *)local_558._0_8_);
    }
    TestSuite::failHandler();
LAB_001a9bc2:
    pthread_mutex_unlock((pthread_mutex_t *)local_498);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)local_538);
LAB_001a9bd9:
    iVar5 = -1;
  }
LAB_001a9bde:
  operator_delete(local_4a0);
  std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::~vector
            ((vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> *)local_4b8)
  ;
  std::__cxx11::
  _List_base<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
  ::_M_clear(&local_468);
LAB_001a9c05:
  if ((_func_void *)local_450._M_unused._0_8_ != (_func_void *)0x0) {
    operator_delete(local_450._M_unused._M_object);
  }
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)local_150);
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)local_270);
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)local_390);
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  return iVar5;
}

Assistant:

int auto_forwarding_test(bool async) {
    reset_log_files();

    std::string s1_addr = "tcp://127.0.0.1:20010";
    std::string s2_addr = "tcp://127.0.0.1:20020";
    std::string s3_addr = "tcp://127.0.0.1:20030";

    RaftAsioPkg s1(1, s1_addr);
    RaftAsioPkg s2(2, s2_addr);
    RaftAsioPkg s3(3, s3_addr);
    std::vector<RaftAsioPkg*> pkgs = {&s1, &s2, &s3};

    _msg("launching asio-raft servers\n");
    CHK_Z( launch_servers(pkgs, false) );

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );

    // Set async.
    for (auto& entry: pkgs) {
        RaftAsioPkg* pp = entry;
        raft_params param = pp->raftServer->get_current_params();
        param.auto_forwarding_ = true;
        param.auto_forwarding_max_connections_ = 2;
        if (async) {
            param.return_method_ = raft_params::async_handler;
        }
        pp->raftServer->update_params(param);
    }

    // Append messages in parallel into S2 (follower).
    struct MsgArgs : TestSuite::ThreadArgs {
        size_t ii;
    };

    std::mutex handlers_lock;
    std::list< ptr< cmd_result< ptr<buffer> > > > handlers;
    auto send_msg = [&](TestSuite::ThreadArgs* t_args) -> int {
        MsgArgs* args = (MsgArgs*)t_args;
        std::string test_msg = "test" + std::to_string(args->ii);
        ptr<buffer> msg = buffer::alloc(test_msg.size() + 1);
        msg->put(test_msg);
        ptr< cmd_result< ptr<buffer> > > ret =
            s2.raftServer->append_entries( {msg} );

        std::lock_guard<std::mutex> l(handlers_lock);
        handlers.push_back(ret);
        return 0;
    };

    const size_t NUM_PARALLEL_MSGS = 20;
    std::vector<TestSuite::ThreadHolder> th(NUM_PARALLEL_MSGS);
    std::vector<MsgArgs> m_args(NUM_PARALLEL_MSGS);
    for (size_t ii = 0; ii < NUM_PARALLEL_MSGS; ++ii) {
        m_args[ii].ii = ii;
        th[ii].spawn(&m_args[ii], send_msg, nullptr);
    }
    TestSuite::sleep_sec(1, "replication");
    for (size_t ii = 0; ii < NUM_PARALLEL_MSGS; ++ii) {
        th[ii].join();
        CHK_Z(th[ii].getResult());
    }

    // All messages should have been committed in the state machine.
    for (size_t ii = 0; ii < NUM_PARALLEL_MSGS; ++ii) {
        std::string test_msg = "test" + std::to_string(ii);
        CHK_GT(s1.getTestSm()->isCommitted(test_msg), 0);
    }

    // All handlers should have the result.
    {
        std::set<uint64_t> commit_results;
        std::lock_guard<std::mutex> l(handlers_lock);
        for (auto& handler: handlers) {
            ptr<buffer> h_result = handler->get();
            CHK_NONNULL(h_result);
            CHK_EQ(8, h_result->size());
            buffer_serializer bs(h_result);
            uint64_t val = bs.get_u64();
            commit_results.insert(val);
        }
        // All messages should have delivered their results.
        CHK_EQ(NUM_PARALLEL_MSGS, commit_results.size());
    }

    // State machine should be identical.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}